

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_findhdrname(char *fname)

{
  int iVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  int local_48;
  int local_44;
  int eisupper;
  int efirst;
  char extzip [4];
  char elist [2] [5];
  char *ext;
  char *hdrname;
  char *basename;
  char *fname_local;
  
  stack0xffffffffffffffc6 = 0x696e2e007264682e;
  stack0xffffffffffffffc2 = 0x7a672e;
  local_44 = 1;
  local_48 = 0;
  iVar1 = nifti_validfilename(fname);
  if (iVar1 == 0) {
    fname_local = (char *)0x0;
  }
  else {
    __s = nifti_makebasename(fname);
    if (__s == (char *)0x0) {
      fname_local = (char *)0x0;
    }
    else {
      pcVar2 = nifti_find_file_extension(fname);
      if (pcVar2 != (char *)0x0) {
        local_48 = is_uppercase(pcVar2);
        iVar1 = nifti_fileexists(fname);
        if (iVar1 != 0) {
          iVar1 = fileext_n_compare(pcVar2,".img",4);
          if (iVar1 != 0) {
            pcVar2 = nifti_strdup(fname);
            free(__s);
            return pcVar2;
          }
          local_44 = 0;
        }
      }
      if (local_48 != 0) {
        make_uppercase((char *)((long)&efirst + 2));
        make_uppercase(extzip + 1);
        make_uppercase((char *)((long)&eisupper + 2));
      }
      sVar3 = strlen(__s);
      fname_local = (char *)calloc(1,sVar3 + 8);
      if (fname_local == (char *)0x0) {
        fprintf(_stderr,"** nifti_findhdrname: failed to alloc hdrname\n");
        free(__s);
        fname_local = (char *)0x0;
      }
      else {
        strcpy(fname_local,__s);
        strcat(fname_local,(char *)((long)&efirst + (long)local_44 * 5 + 2));
        iVar1 = nifti_fileexists(fname_local);
        if (iVar1 == 0) {
          strcat(fname_local,(char *)((long)&eisupper + 2));
          iVar1 = nifti_fileexists(fname_local);
          if (iVar1 == 0) {
            strcpy(fname_local,__s);
            strcat(fname_local,(char *)((long)&efirst + (long)(1 - local_44) * 5 + 2));
            iVar1 = nifti_fileexists(fname_local);
            if (iVar1 == 0) {
              strcat(fname_local,(char *)((long)&eisupper + 2));
              iVar1 = nifti_fileexists(fname_local);
              if (iVar1 == 0) {
                free(__s);
                free(fname_local);
                fname_local = (char *)0x0;
              }
              else {
                free(__s);
              }
            }
            else {
              free(__s);
            }
          }
          else {
            free(__s);
          }
        }
        else {
          free(__s);
        }
      }
    }
  }
  return fname_local;
}

Assistant:

char * nifti_findhdrname(const char* fname)
{
   char *basename, *hdrname;
   const char *ext;
   char  elist[2][5] = { ".hdr", ".nii" };
   char  extzip[4]   = ".gz";
   int   efirst = 1;    /* init to .nii extension */
   int   eisupper = 0;  /* init to lowercase extensions */

   /**- check input file(s) for sanity */
   if( !nifti_validfilename(fname) ) return NULL;

   basename = nifti_makebasename(fname);
   if( !basename ) return NULL;   /* only on string alloc failure */

   /**- return filename if it has a valid extension and exists
         (except if it is an .img file (and maybe .gz)) */
   ext = nifti_find_file_extension(fname);

   if( ext ) eisupper = is_uppercase(ext);  /* do we look for uppercase? */

   /* if the file exists and is a valid header name (not .img), return it */
   if ( ext && nifti_fileexists(fname) ) {
     /* allow for uppercase extension */
     if ( fileext_n_compare(ext,".img",4) != 0 ){
        hdrname = nifti_strdup(fname);
        free(basename);
        return hdrname;
     } else
        efirst = 0;     /* note for below */
   }

   /* So the requested name is a basename, contains .img, or does not exist. */
   /* In any case, use basename. */

   /**- if .img, look for .hdr, .hdr.gz, .nii, .nii.gz, in that order */
   /**- else,    look for .nii, .nii.gz, .hdr, .hdr.gz, in that order */

   /* if we get more extension choices, this could be a loop */

   /* note: efirst is 0 in the case of ".img" */

   /* if the user passed an uppercase entension (.IMG), search for uppercase */
   if( eisupper ) {
      make_uppercase(elist[0]);
      make_uppercase(elist[1]);
      make_uppercase(extzip);
   }

   hdrname = (char *)calloc(sizeof(char),strlen(basename)+8);
   if( !hdrname ){
      fprintf(stderr,"** nifti_findhdrname: failed to alloc hdrname\n");
      free(basename);
      return NULL;
   }

   strcpy(hdrname,basename);
   strcat(hdrname,elist[efirst]);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#ifdef HAVE_ZLIB
   strcat(hdrname,extzip);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#endif

   /* okay, try the other possibility */

   efirst = 1 - efirst;

   strcpy(hdrname,basename);
   strcat(hdrname,elist[efirst]);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#ifdef HAVE_ZLIB
   strcat(hdrname,extzip);
   if (nifti_fileexists(hdrname)) { free(basename); return hdrname; }
#endif

   /**- if nothing has been found, return NULL */
   free(basename);
   free(hdrname);
   return NULL;
}